

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O1

UniquePtr<StyleSheet> __thiscall
Rml::StyleSheet::CombineStyleSheet(StyleSheet *this,StyleSheet *other_sheet)

{
  StyleSheetNode *__ptr_00;
  StyleSheetNode *pSVar1;
  StyleSheetNode *in_RAX;
  _Head_base<0UL,_Rml::StyleSheetNode_*,_false> this_00;
  StyleSheet *in_RDX;
  pointer *__ptr_1;
  pointer *__ptr;
  StyleSheetNode *local_28;
  
  local_28 = in_RAX;
  this_00._M_head_impl = (StyleSheetNode *)operator_new(0x1c0);
  StyleSheet((StyleSheet *)this_00._M_head_impl);
  (this->root)._M_t.
  super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>._M_t.
  super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
  super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl = this_00._M_head_impl;
  StyleSheetNode::DeepCopy
            ((StyleSheetNode *)&stack0xffffffffffffffd8,
             (other_sheet->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl);
  pSVar1 = local_28;
  local_28 = (StyleSheetNode *)0x0;
  __ptr_00 = (this_00._M_head_impl)->parent;
  (this_00._M_head_impl)->parent = pSVar1;
  if (__ptr_00 != (StyleSheetNode *)0x0) {
    ::std::default_delete<Rml::StyleSheetNode>::operator()
              ((default_delete<Rml::StyleSheetNode> *)this_00._M_head_impl,__ptr_00);
  }
  if (local_28 != (StyleSheetNode *)0x0) {
    ::std::default_delete<Rml::StyleSheetNode>::operator()
              ((default_delete<Rml::StyleSheetNode> *)&stack0xffffffffffffffd8,local_28);
  }
  *(int *)&((this_00._M_head_impl)->selector).tag = other_sheet->specificity_offset;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 8),&other_sheet->keyframes);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 0x38),&other_sheet->named_decorator_map)
  ;
  ::std::
  vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
  ::operator=((vector<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 0x68),
              &(other_sheet->spritesheet_list).spritesheets);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(this_00._M_head_impl)->selector + 0x80),
              &(other_sheet->spritesheet_list).sprite_map);
  MergeStyleSheet((StyleSheet *)this_00._M_head_impl,in_RDX);
  return (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)
         (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)this;
}

Assistant:

UniquePtr<StyleSheet> StyleSheet::CombineStyleSheet(const StyleSheet& other_sheet) const
{
	RMLUI_ZoneScoped;

	UniquePtr<StyleSheet> new_sheet = UniquePtr<StyleSheet>(new StyleSheet());

	new_sheet->root = root->DeepCopy();
	new_sheet->specificity_offset = specificity_offset;
	new_sheet->keyframes = keyframes;
	new_sheet->named_decorator_map = named_decorator_map;
	new_sheet->spritesheet_list = spritesheet_list;

	new_sheet->MergeStyleSheet(other_sheet);

	return new_sheet;
}